

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucoseCmd.cpp
# Opt level: O1

int Abc_CommandGlucose(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *format;
  ulong uVar4;
  uint local_54;
  ulong local_50;
  Glucose_Pars local_40;
  
  Extra_UtilGetoptReset();
  local_50 = 0;
  local_54 = 1;
  uVar4 = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Cpvh"), iVar3 = globalUtilOptind, iVar1 != 0x43) {
      if (iVar1 == -1) {
        local_40._0_8_ = (ulong)local_54 | local_50 << 0x20;
        local_40._8_8_ = uVar4 << 0x20;
        if (globalUtilOptind + 1 == argc) {
          Glucose_SolveCnf(argv[globalUtilOptind],&local_40);
          return 0;
        }
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          iVar3 = Glucose_SolveAig(pAbc->pGia,&local_40);
          if (iVar3 != 10) {
            return 0;
          }
          Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
          return 0;
        }
        format = "Abc_CommandGlucose(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_005b5d43;
      }
      if (iVar1 == 0x70) {
        local_54 = local_54 ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_005b5cb9;
        local_50 = (ulong)((uint)local_50 ^ 1);
      }
    }
    if (argc <= globalUtilOptind) break;
    uVar2 = atoi(argv[globalUtilOptind]);
    uVar4 = (ulong)uVar2;
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_005b5cb9:
      Abc_Print(-2,"usage: &glucose [-C num] [-pvh] <file.cnf>\n");
      Abc_Print(-2,"\t             run Glucose 3.0 by Gilles Audemard and Laurent Simon\n");
      Abc_Print(-2,"\t-C num     : conflict limit [default = %d]\n",uVar4);
      Abc_Print(-2,"\t-p         : enable preprocessing [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"\t-v         : verbosity [default = %d]\n",local_50);
      Abc_Print(-2,"\t-h         : print the command usage\n");
      format = "\t<file.cnf> : (optional) CNF file to solve\n";
      iVar3 = -2;
LAB_005b5d43:
      Abc_Print(iVar3,format);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_005b5cb9;
}

Assistant:

int Abc_CommandGlucose( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c       = 0;
    int pre     = 1;
    int verb    = 0;
    int nConfls = 0;

    Glucose_Pars pPars;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cpvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'C':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                    goto usage;
                }
                nConfls = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nConfls < 0 )
                    goto usage;
                break;
            case 'p':
                pre ^= 1;
                break;
            case 'v':
                verb ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    pPars = Glucose_CreatePars(pre,verb,0,nConfls);

    if ( argc == globalUtilOptind + 1 )
    {
        Glucose_SolveCnf( argv[globalUtilOptind], &pPars );
        return 0;
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandGlucose(): There is no AIG.\n" );
        return 1;
    }
    
    if ( Glucose_SolveAig( pAbc->pGia, &pPars ) == 10 )
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );

    return 0;
    
usage:
    Abc_Print( -2, "usage: &glucose [-C num] [-pvh] <file.cnf>\n" );
    Abc_Print( -2, "\t             run Glucose 3.0 by Gilles Audemard and Laurent Simon\n" );
    Abc_Print( -2, "\t-C num     : conflict limit [default = %d]\n",  nConfls );
    Abc_Print( -2, "\t-p         : enable preprocessing [default = %d]\n",pre);
    Abc_Print( -2, "\t-v         : verbosity [default = %d]\n",verb);
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file.cnf> : (optional) CNF file to solve\n");
    return 1;
}